

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_filter.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::IsNotNullFilter::ToExpression(IsNotNullFilter *this,Expression *column)

{
  BoundOperatorExpression *this_00;
  pointer pBVar1;
  long *in_RDX;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_40;
  LogicalType local_38;
  
  this_00 = (BoundOperatorExpression *)operator_new(0x70);
  LogicalType::LogicalType(&local_38,BOOLEAN);
  BoundOperatorExpression::BoundOperatorExpression(this_00,OPERATOR_IS_NOT_NULL,&local_38);
  local_40._M_head_impl = this_00;
  LogicalType::~LogicalType(&local_38);
  pBVar1 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                         *)&local_40);
  (**(code **)(*in_RDX + 0x88))(&local_38);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&pBVar1->children,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_38);
  if ((long *)local_38._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_38._0_8_ + 8))();
  }
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)local_40._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> IsNotNullFilter::ToExpression(const Expression &column) const {
	auto result = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_IS_NOT_NULL, LogicalType::BOOLEAN);
	result->children.push_back(column.Copy());
	return std::move(result);
}